

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall (anonymous_namespace)::PeerManagerImpl::InitializeNode(PeerManagerImpl *this)

{
  long in_FS_OFFSET;
  CNode *in_stack_00000058;
  PeerManagerImpl *in_stack_00000060;
  ServiceFlags in_stack_000000a8;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    anon_unknown.dwarf_1b21075::PeerManagerImpl::InitializeNode
              (in_stack_00000060,in_stack_00000058,in_stack_000000a8);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::InitializeNode(const CNode& node, ServiceFlags our_services)
{
    NodeId nodeid = node.GetId();
    {
        LOCK(cs_main); // For m_node_states
        m_node_states.try_emplace(m_node_states.end(), nodeid);
    }
    {
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Count(nodeid) == 0);
    }

    if (NetPermissions::HasFlag(node.m_permission_flags, NetPermissionFlags::BloomFilter)) {
        our_services = static_cast<ServiceFlags>(our_services | NODE_BLOOM);
    }

    PeerRef peer = std::make_shared<Peer>(nodeid, our_services, node.IsInboundConn());
    {
        LOCK(m_peer_mutex);
        m_peer_map.emplace_hint(m_peer_map.end(), nodeid, peer);
    }
}